

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double tpdf(double t,int df)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double pi;
  double f3;
  double f2;
  double f1;
  double ft;
  int df_local;
  double t_local;
  
  if (df < 1) {
    printf("Degree Of Freedom should be a positive real integer");
    exit(1);
  }
  dVar1 = gamma_log(((double)df + 1.0) / 2.0);
  dVar2 = gamma_log((double)df / 2.0);
  dVar1 = exp(dVar1 - dVar2);
  dVar2 = pow((t * t) / ((double)df * 1.0) + 1.0,-((double)df + 1.0) / 2.0);
  dVar3 = sqrt((double)df * 3.141592653589793);
  return (dVar1 * dVar2) / dVar3;
}

Assistant:

double tpdf(double t, int df) {
	double ft,f1,f2,f3;
	double pi  = 3.1415926535897932384626434;
	
	if (df <= 0) {
		printf("Degree Of Freedom should be a positive real integer");
		exit(1);
	}
	
	f1 = gamma_log((double) (df+1.0)/2.0) - gamma_log((double) (df/2.0));
	f2 = exp(f1);
	f3 = pow(1.0 + (t*t / (df * 1.0)), - (df+1.0)/2.0);
	ft = f2 * f3 ;
	ft = ft / sqrt( (double) pi * df); 
	
	return ft;
	
}